

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O2

bool __thiscall Kumu::Timestamp::Archive(Timestamp *this,MemIOWriter *Writer)

{
  bool bVar1;
  ui8_t second;
  ui8_t minute;
  ui8_t hour;
  ui8_t day;
  ui8_t month;
  ui16_t year;
  ui8_t local_17;
  ui8_t local_16;
  ui8_t local_15;
  ui8_t local_14;
  ui8_t local_13;
  ui16_t local_12;
  
  if (Writer == (MemIOWriter *)0x0) {
    __assert_fail("Writer",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                  ,0x3ed,"virtual bool Kumu::Timestamp::Archive(MemIOWriter *) const");
  }
  GetComponents(this,&local_12,&local_13,&local_14,&local_15,&local_16,&local_17);
  bVar1 = MemIOWriter::WriteUi16BE(Writer,local_12);
  if (bVar1) {
    bVar1 = MemIOWriter::WriteUi8(Writer,local_13);
    if (bVar1) {
      bVar1 = MemIOWriter::WriteUi8(Writer,local_14);
      if (bVar1) {
        bVar1 = MemIOWriter::WriteUi8(Writer,local_15);
        if (bVar1) {
          bVar1 = MemIOWriter::WriteUi8(Writer,local_16);
          if (bVar1) {
            bVar1 = MemIOWriter::WriteUi8(Writer,local_17);
            if (bVar1) {
              bVar1 = MemIOWriter::WriteUi8(Writer,'\0');
              return bVar1;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool
Kumu::Timestamp::Archive(MemIOWriter* Writer) const
{
  assert(Writer);

  ui16_t year;
  ui8_t month, day, hour, minute, second, tick = 0;
  GetComponents(year, month, day, hour, minute, second);

  if ( ! Writer->WriteUi16BE(year) ) return false;	
  if ( ! Writer->WriteUi8(month) ) return false;
  if ( ! Writer->WriteUi8(day) ) return false;
  if ( ! Writer->WriteUi8(hour) ) return false;
  if ( ! Writer->WriteUi8(minute) ) return false;
  if ( ! Writer->WriteUi8(second) ) return false;
  if ( ! Writer->WriteUi8(tick) ) return false;
  return true;
}